

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O0

string * __thiscall TestNLHandler::EndNumberOf_abi_cxx11_(TestNLHandler *this,ArgHandler *h)

{
  string *in_RDX;
  string *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000001f8;
  string *in_stack_00000200;
  TestNLHandler *in_stack_00000208;
  string local_38 [56];
  
  std::__cxx11::string::string(local_38,in_RDX);
  MakeVarArg(in_stack_00000208,in_stack_00000200,in_stack_000001f8);
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

std::string EndNumberOf(ArgHandler h) { return MakeVarArg(h.name_, h.args_); }